

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

int Internal_CompareEnglishLogfontNameEtc(ON_Font **lhs,ON_Font **rhs)

{
  int rc;
  ON_Font **rhs_local;
  ON_Font **lhs_local;
  
  lhs_local._4_4_ = ON_FontList::CompareEnglishWindowsLogfontName(lhs,rhs);
  if (((lhs_local._4_4_ == 0) &&
      (lhs_local._4_4_ = ON_FontList::CompareWeightStretchStyle(lhs,rhs), lhs_local._4_4_ == 0)) &&
     (lhs_local._4_4_ = ON_FontList::CompareUnderlinedStrikethroughPointSize(lhs,rhs),
     lhs_local._4_4_ == 0)) {
    lhs_local._4_4_ = ON_FontList::CompareFontCharacteristicsHash(lhs,rhs);
  }
  return lhs_local._4_4_;
}

Assistant:

static int Internal_CompareEnglishLogfontNameEtc(ON_Font const* const* lhs, ON_Font const* const* rhs)
{
  int rc = ON_FontList::CompareEnglishWindowsLogfontName(lhs, rhs);
  if (0 != rc)
    return rc;

  rc = ON_FontList::CompareWeightStretchStyle(lhs, rhs);
  if (0 != rc)
    return rc;

  rc = ON_FontList::CompareUnderlinedStrikethroughPointSize(lhs, rhs);
  if (0 != rc)
    return rc;

  return ON_FontList::CompareFontCharacteristicsHash(lhs, rhs);
}